

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<std::pair<QString,_int>_>::reserve(QList<std::pair<QString,_int>_> *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QGenericArrayOps<std::pair<QString,_int>_> *this_00;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<std::pair<QString,_int>_> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  pair<QString,_int> *in_stack_ffffffffffffff60;
  QArrayDataPointer<std::pair<QString,_int>_> *in_stack_ffffffffffffff68;
  pair<QString,_int> *b;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<std::pair<QString,_int>_> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  pair<QString,_int> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QList<std::pair<QString,_int>_> *)0x8bce15);
  qVar3 = QArrayDataPointer<std::pair<QString,_int>_>::freeSpaceAtBegin(in_stack_ffffffffffffff68);
  if (in_RSI <= qVar2 - qVar3) {
    QArrayDataPointer<std::pair<QString,_int>_>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<std::pair<QString,_int>_>::flags
                   ((QArrayDataPointer<std::pair<QString,_int>_> *)in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_008bcff1;
    QArrayDataPointer<std::pair<QString,_int>_>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<std::pair<QString,_int>_>::isShared
                      ((QArrayDataPointer<std::pair<QString,_int>_> *)in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<std::pair<QString,_int>_>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<std::pair<QString,_int>_>::setFlag
                ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8bcecf,
                 (ArrayOptions)in_stack_ffffffffffffff5c.i);
      goto LAB_008bcff1;
    }
  }
  local_38.first.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.first.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.first.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<std::pair<QString,_int>_> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  b = &local_38;
  QArrayDataPointer<std::pair<QString,_int>_>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)b >> 0x20));
  this_00 = (QGenericArrayOps<std::pair<QString,_int>_> *)
            QArrayDataPointer<std::pair<QString,_int>_>::operator->
                      ((QArrayDataPointer<std::pair<QString,_int>_> *)b);
  QArrayDataPointer<std::pair<QString,_int>_>::operator->(in_RDI);
  QArrayDataPointer<std::pair<QString,_int>_>::begin
            ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8bcf51);
  QArrayDataPointer<std::pair<QString,_int>_>::operator->(in_RDI);
  QArrayDataPointer<std::pair<QString,_int>_>::end
            ((QArrayDataPointer<std::pair<QString,_int>_> *)in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<std::pair<QString,_int>_>::copyAppend
            (this_00,b,in_stack_ffffffffffffff60);
  pDVar4 = QArrayDataPointer<std::pair<QString,_int>_>::d_ptr
                     ((QArrayDataPointer<std::pair<QString,_int>_> *)&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (pair<QString,_int> *)
         QArrayDataPointer<std::pair<QString,_int>_>::operator->
                   ((QArrayDataPointer<std::pair<QString,_int>_> *)&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<std::pair<QString,_int>_>::setFlag
              ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8bcfb8,
               (ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<std::pair<QString,_int>_>::swap
            ((QArrayDataPointer<std::pair<QString,_int>_> *)in_stack_ffffffffffffff60,
             (QArrayDataPointer<std::pair<QString,_int>_> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<std::pair<QString,_int>_>::~QArrayDataPointer
            ((QArrayDataPointer<std::pair<QString,_int>_> *)in_stack_ffffffffffffff60);
LAB_008bcff1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}